

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O1

void aom_fft8x8_float_c(float *input,float *temp,float *output)

{
  ulong uVar1;
  ulong uVar2;
  int y;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  float fVar8;
  float fVar9;
  
  lVar6 = 0;
  do {
    aom_fft1d_8_float((float *)((long)input + lVar6),(float *)((long)output + lVar6),8);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x20);
  lVar6 = 0;
  pfVar3 = output;
  pfVar4 = temp;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pfVar4 + lVar5) = pfVar3[lVar5 * 2];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x20);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 8;
    pfVar3 = pfVar3 + 1;
  } while (lVar6 != 8);
  lVar6 = 0;
  do {
    aom_fft1d_8_float((float *)((long)temp + lVar6),(float *)((long)output + lVar6),8);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x20);
  lVar6 = 0;
  pfVar3 = output;
  pfVar4 = temp;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pfVar4 + lVar5) = pfVar3[lVar5 * 2];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x20);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 8;
    pfVar3 = pfVar3 + 1;
  } while (lVar6 != 8);
  pfVar7 = temp + 0x24;
  pfVar3 = output + 0x81;
  pfVar4 = output + 1;
  lVar6 = 0;
  do {
    uVar1 = lVar6 - 1;
    lVar5 = 0;
    do {
      uVar2 = lVar5 - 1;
      fVar8 = 0.0;
      fVar9 = 0.0;
      if (uVar2 < 3 && uVar1 < 3) {
        fVar9 = pfVar7[lVar5];
      }
      pfVar4[lVar5 * 2 + -1] = pfVar7[lVar5 + -0x24] - fVar9;
      if (uVar1 < 3) {
        fVar8 = pfVar7[lVar5 + -4];
      }
      fVar9 = 0.0;
      if (uVar2 < 3) {
        fVar9 = pfVar7[lVar5 + -0x20];
      }
      pfVar4[lVar5 * 2] = fVar8 + fVar9;
      if (uVar1 < 3) {
        fVar8 = 0.0;
        fVar9 = 0.0;
        if (uVar2 < 3 && uVar1 < 3) {
          fVar9 = pfVar7[lVar5];
        }
        pfVar3[lVar5 * 2 + -1] = fVar9 + pfVar7[lVar5 + -0x24];
        if (uVar2 < 3) {
          fVar8 = pfVar7[lVar5 + -0x20];
        }
        pfVar3[lVar5 * 2] = fVar8 - pfVar7[lVar5 + -4];
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    lVar6 = lVar6 + 1;
    pfVar7 = pfVar7 + 8;
    pfVar3 = pfVar3 + -0x10;
    pfVar4 = pfVar4 + 0x10;
  } while (lVar6 != 5);
  return;
}

Assistant:

void aom_fft8x8_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 8, aom_fft1d_8_float, simple_transpose,
                 unpack_2d_output, 1);
}